

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fmt_fraction.h
# Opt level: O0

bool date::
     read_impl<date::iterator_proxy<std::istreambuf_iterator<char,std::char_traits<char>>>,unsigned_int,9u>
               (iterator_proxy<std::istreambuf_iterator<char,_std::char_traits<char>_>_> *pos,
               iterator_proxy<std::istreambuf_iterator<char,_std::char_traits<char>_>_> *end,
               fraction_t<unsigned_int,_9U> *fmt)

{
  bool bVar1;
  value_type vVar2;
  ulong uStack_38;
  char_type ch;
  size_t count;
  uint x;
  fraction_t<unsigned_int,_9U> *fmt_local;
  iterator_proxy<std::istreambuf_iterator<char,_std::char_traits<char>_>_> *end_local;
  iterator_proxy<std::istreambuf_iterator<char,_std::char_traits<char>_>_> *pos_local;
  
  count._4_4_ = 0;
  uStack_38 = 0;
  while ((((uStack_38 < 9 &&
           (bVar1 = iterator_proxy<std::istreambuf_iterator<char,_std::char_traits<char>_>_>::
                    operator==(pos,end), !bVar1)) &&
          (vVar2 = iterator_proxy<std::istreambuf_iterator<char,_std::char_traits<char>_>_>::
                   operator*(pos), '/' < vVar2)) && (vVar2 < ':'))) {
    count._4_4_ = count._4_4_ * 10 + vVar2 + -0x30;
    uStack_38 = uStack_38 + 1;
    iterator_proxy<std::istreambuf_iterator<char,_std::char_traits<char>_>_>::operator++(pos);
  }
  if (uStack_38 == 0) {
    pos_local._7_1_ = false;
  }
  else {
    for (; uStack_38 < 9; uStack_38 = uStack_38 + 1) {
      count._4_4_ = count._4_4_ * 10;
    }
    *fmt->value = count._4_4_;
    pos_local._7_1_ =
         read_impl<date::iterator_proxy<std::istreambuf_iterator<char,std::char_traits<char>>>>
                   (pos,end);
  }
  return pos_local._7_1_;
}

Assistant:

bool read_impl(Iterator& pos, const Iterator& end, fraction_t<UnsignedInt, Width>& fmt, Others&&... others)
{
    using char_type  = typename iterator_traits<Iterator>::value_type;

    auto x = UnsignedInt{ 0 };
    auto count = std::size_t{ 0 };
    while (count < Width)
    {
        if (pos == end)
            break;

        const char_type ch = *pos;
        if ((ch < char_type{ '0' }) || (ch > char_type{ '9' }))
            break;

        x = 10 * x + static_cast<UnsignedInt>(ch - char_type{ '0' });
        ++count;
        ++pos; 
    }

    if (count == 0)
        return false;

    while (count < Width)
    {
        x = 10 * x;
        ++count;
    }
    
    fmt.value = x;
    return read_impl(pos, end, std::forward<Others>(others)...);
}